

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border_agent.cpp
# Opt level: O0

void __thiscall ot::commissioner::BorderAgent::BorderAgent(BorderAgent *this)

{
  UnixTime local_1b0;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  allocator local_131;
  string local_130;
  Timestamp local_110;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  State local_90;
  allocator local_89;
  string local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68 [2];
  allocator local_31;
  string local_30;
  BorderAgent *local_10;
  BorderAgent *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_3ea58f + 9,&local_31);
  local_68[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68[0].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,anon_var_dwarf_3ea58f + 9,&local_89);
  State::State(&local_90,0,0,0,0,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,anon_var_dwarf_3ea58f + 9,&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,anon_var_dwarf_3ea58f + 9,&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,anon_var_dwarf_3ea58f + 9,&local_101);
  local_110 = (Timestamp)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,anon_var_dwarf_3ea58f + 9,&local_131);
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,anon_var_dwarf_3ea58f + 9,&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,anon_var_dwarf_3ea58f + 9,&local_1a1);
  UnixTime::UnixTime(&local_1b0,0);
  BorderAgent(this,&local_30,0,local_68,&local_88,local_90,&local_b0,0,&local_d8,&local_100,
              local_110,0,&local_130,&local_158,&local_178,'\0',0,&local_1a0,local_1b0,0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_158);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

BorderAgent::BorderAgent()
    : BorderAgent{
          "", 0,  ByteArray{}, "", State{0, 0, 0, 0, 0}, "", 0, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0,
          0,  "", 0,           0}
{
}